

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O1

int __thiscall
highs::RbTree<HighsNodeQueue::NodeHybridEstimRbTree>::unlink
          (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *this,char *__name)

{
  LinkType LVar1;
  int iVar2;
  int extraout_EAX;
  long extraout_RAX;
  long extraout_RAX_00;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long v;
  bool bVar8;
  LinkType nilParent;
  LinkType local_48;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *local_40;
  ulong local_38;
  long lVar3;
  
  local_48 = -1;
  if (__name == (char *)0xffffffffffffffff) {
    bVar8 = true;
  }
  else {
    bVar8 = -1 < *(long *)(this[2].rootNode[1] + 0x88 + (long)__name * 0x90);
  }
  lVar3 = this[2].rootNode[1];
  lVar6 = (long)__name * 0x90;
  lVar7 = *(long *)(lVar3 + 0x78 + lVar6);
  v = *(long *)(lVar3 + 0x80 + lVar6);
  if (lVar7 == -1) {
    transplant(this,(LinkType)__name,v,&local_48);
    lVar3 = extraout_RAX;
    goto LAB_002d2512;
  }
  if (v == -1) {
    transplant(this,(LinkType)__name,lVar7,&local_48);
    lVar3 = extraout_RAX_00;
    v = lVar7;
    goto LAB_002d2512;
  }
  do {
    lVar7 = v;
    v = *(long *)(lVar3 + 0x78 + lVar7 * 0x90);
  } while (v != -1);
  if (lVar7 == -1) {
    bVar8 = true;
  }
  else {
    bVar8 = -1 < *(long *)(lVar3 + 0x88 + lVar7 * 0x90);
  }
  lVar5 = lVar7 * 0x90;
  v = *(long *)(lVar3 + 0x80 + lVar5);
  local_38 = 0x7fffffffffffffff;
  local_40 = this;
  if ((char *)((*(ulong *)(lVar3 + 0x88 + lVar5) & 0x7fffffffffffffff) - 1) == __name) {
    lVar4 = v;
    LVar1 = lVar7;
    if (v != -1) goto LAB_002d2483;
  }
  else {
    transplant(this,lVar7,v,&local_48);
    lVar3 = local_40[2].rootNode[1];
    lVar4 = *(long *)(lVar3 + 0x80 + lVar6);
    *(long *)(lVar3 + 0x80 + lVar5) = lVar4;
LAB_002d2483:
    *(ulong *)(lVar3 + 0x88 + lVar4 * 0x90) =
         lVar7 + 1U | *(ulong *)(lVar3 + 0x88 + lVar4 * 0x90) & 0x8000000000000000;
    LVar1 = local_48;
  }
  local_48 = LVar1;
  transplant(local_40,(LinkType)__name,lVar7,&local_48);
  lVar3 = local_40[2].rootNode[1];
  lVar4 = *(long *)(lVar3 + 0x78 + lVar6);
  *(long *)(lVar3 + 0x78 + lVar5) = lVar4;
  lVar4 = lVar4 * 0x90;
  *(ulong *)(lVar3 + 0x88 + lVar4) =
       lVar7 + 1U | *(ulong *)(lVar3 + 0x88 + lVar4) & 0x8000000000000000;
  *(ulong *)(lVar3 + 0x88 + lVar5) =
       *(ulong *)(lVar3 + 0x88 + lVar6) & 0x8000000000000000 |
       local_38 & *(ulong *)(lVar3 + 0x88 + lVar5);
  this = local_40;
LAB_002d2512:
  iVar2 = (int)lVar3;
  if (bVar8) {
    deleteFixup(this,v,local_48);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void unlink(LinkType z) {
    LinkType nilParent = kNoLink;
    LinkType y = z;
    bool yWasBlack = isBlack(y);
    LinkType x;

    if (getChild(z, kLeft) == kNoLink) {
      x = getChild(z, kRight);
      transplant(z, x, nilParent);
    } else if (getChild(z, kRight) == kNoLink) {
      x = getChild(z, kLeft);
      transplant(z, x, nilParent);
    } else {
      y = first(getChild(z, kRight));
      yWasBlack = isBlack(y);
      x = getChild(y, kRight);
      if (getParent(y) == z) {
        if (x == kNoLink)
          nilParent = y;
        else
          setParent(x, y);
      } else {
        transplant(y, getChild(y, kRight), nilParent);
        LinkType zRight = getChild(z, kRight);
        setChild(y, kRight, zRight);
        setParent(zRight, y);
      }
      transplant(z, y, nilParent);
      LinkType zLeft = getChild(z, kLeft);
      setChild(y, kLeft, zLeft);
      setParent(zLeft, y);
      setColor(y, getColor(z));
    }

    if (yWasBlack) deleteFixup(x, nilParent);
  }